

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O2

int rackH2(void)

{
  long lVar1;
  difference_type dVar2;
  int iVar3;
  int iVar4;
  int aiStack_17c [59];
  undefined8 uStack_90;
  undefined1 local_7a;
  undefined1 local_79;
  int freq [27];
  
  uStack_90 = 0x1a;
  for (lVar1 = 0x1a; lVar1 != -1; lVar1 = lVar1 + -1) {
    freq[lVar1] = 0;
  }
  lVar1 = (long)rack_size;
  while (lVar1 != 0) {
    aiStack_17c[rack[lVar1 + -1]] = aiStack_17c[rack[lVar1 + -1]] + 1;
    lVar1 = lVar1 + -1;
  }
  uStack_90 = 2;
  iVar3 = 0;
  for (lVar1 = 0; lVar1 != 0x1b; lVar1 = lVar1 + 1) {
    iVar4 = freq[lVar1];
    if (iVar4 != 0) {
      iVar3 = iVar3 + (((iVar4 + -1) * H2[lVar1][1]) / 2 + H2[lVar1][0]) * iVar4;
    }
  }
  local_79 = 0x55;
  uStack_90 = 0x108073;
  dVar2 = std::__count_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (rack,rack + rack_size,(_Iter_equals_val<const_char>)&local_79);
  iVar4 = iVar3;
  if (dVar2 != 0) {
    local_7a = 0x51;
    uStack_90 = 0x108096;
    dVar2 = std::__count_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (rack,rack + rack_size,(_Iter_equals_val<const_char>)&local_7a);
    iVar4 = iVar3 + 0x5dc;
    if (dVar2 == 0) {
      iVar4 = iVar3;
    }
  }
  iVar3 = ~((freq[4] + freq[0] + freq[8] + freq[0xe] + freq[0x14]) * 2) + rack_size;
  return iVar3 * iVar3 * -0x32 + iVar4;
}

Assistant:

int rackH2() {
    int sum = 0;
    int freq[27];
    for (int i = 27; i--;) freq[i] = 0;
    for (int i = rack_size; i--;) {
        freq[rack[i] - 'A']++;
    }
    for (char c = 'A'; c <= 'A' + 26; c++) {
        if (freq[c - 'A'])
            sum += freq[c - 'A'] * (H2[c - 'A'][0] + (freq[c - 'A'] - 1) * H2[c - 'A'][1] / 2);
    }
    if (std::count(rack, rack + rack_size, 'U') && std::count(rack, rack + rack_size, 'Q')) sum += 1500;

    // vowels: A,E,I,O,U
    int num_vowels = freq[0] + freq['E' - 'A'] + freq['I' - 'A'] + freq['O' - 'A'] + freq['U' - 'A'];
    // consonants - vowels balance
    int bal = rack_size - num_vowels * 2 - 1; // ideally 3 vowels and 4 consonants
    sum -= bal * bal * 50; // max -2450 for 6 vowel leave
    return sum;
}